

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcDictEntry::CTcDictEntry(CTcDictEntry *this,CTcSymObj *sym)

{
  CVmHashTable *this_00;
  undefined8 *puVar1;
  
  this->sym_ = sym;
  this->obj_idx_ = 0;
  this->nxt_ = (CTcDictEntry *)0x0;
  this_00 = (CVmHashTable *)CTcPrsMem::alloc(G_prsmem,0x20);
  puVar1 = (undefined8 *)CTcPrsMem::alloc(G_prsmem,8);
  *puVar1 = &PTR__CVmHashFunc_0031c858;
  CTcPrsMem::alloc(G_prsmem,0x400);
  CVmHashTable::init(this_00,(EVP_PKEY_CTX *)0x80);
  this->hashtab_ = this_00;
  return;
}

Assistant:

CTcDictEntry::CTcDictEntry(CTcSymObj *sym)
{
    const size_t hash_table_size = 128;

    /* remember my object symbol and word truncation length */
    sym_ = sym;

    /* no object file index yet */
    obj_idx_ = 0;

    /* not in a list yet */
    nxt_ = 0;

    /* create my hash table */
    hashtab_ = new (G_prsmem)
               CVmHashTable(hash_table_size,
                            new (G_prsmem) CVmHashFuncCI(), TRUE,
                            new (G_prsmem) CVmHashEntry *[hash_table_size]);
}